

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

uint8 * __thiscall
Messages::Person::_InternalSerialize(Person *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  string *psVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  Type *this_00;
  uint uVar6;
  uint uVar7;
  int index;
  uint8 *puVar8;
  uint8 *puVar9;
  
  uVar6 = (this->_has_bits_).has_bits_[0];
  if ((uVar6 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "Messages.Person.name");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(this->name_).ptr_,target);
  }
  if ((uVar6 & 4) != 0) {
    if (*(uint8 **)stream <= target) {
      target = (uint8 *)google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
                                  ((uchar *)stream);
    }
    uVar7 = this->id_;
    *target = '\x10';
    if ((ulong)(long)(int)uVar7 < 0x80) {
      target[1] = (byte)uVar7;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      uVar4 = (ulong)(long)(int)uVar7 >> 7;
      if (uVar7 < 0x4000) {
        target[2] = (uint8)uVar4;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar8 = target;
          puVar8[-1] = (byte)uVar4 | 0x80;
          uVar5 = uVar4 >> 7;
          target = puVar8 + 1;
          bVar3 = 0x3fff < uVar4;
          uVar4 = uVar5;
        } while (bVar3);
        *puVar8 = (uint8)uVar5;
      }
    }
  }
  if ((uVar6 & 2) != 0) {
    psVar2 = (this->email_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "Messages.Person.email");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,3,(this->email_).ptr_,target);
  }
  iVar1 = (this->phones_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (*(uint8 **)stream <= target) {
        target = (uint8 *)google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
                                    ((uchar *)stream);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::TypeHandler>
                          (&(this->phones_).super_RepeatedPtrFieldBase,index);
      *target = '\"';
      uVar6 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar6 < 0x80) {
        target[1] = (byte)uVar6;
        puVar8 = target + 2;
      }
      else {
        target[1] = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          target[2] = (uint8)(uVar6 >> 7);
          puVar8 = target + 3;
        }
        else {
          puVar8 = target + 3;
          uVar6 = uVar6 >> 7;
          do {
            puVar9 = puVar8;
            puVar9[-1] = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            puVar8 = puVar9 + 1;
            bVar3 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar3);
          *puVar9 = (uint8)uVar7;
        }
      }
      target = Person_PhoneNumber::_InternalSerialize(this_00,puVar8,stream);
      index = index + 1;
    } while (index != iVar1);
  }
  if ((*(ulong *)&this->field_0x8 & 1) != 0) {
    puVar8 = (uint8 *)google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                                ((UnknownFieldSet *)
                                 ((*(ulong *)&this->field_0x8 & 0xfffffffffffffffe) + 8),target,
                                 stream);
    return puVar8;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Person::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:Messages.Person)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // required string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "Messages.Person.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // required int32 id = 2;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_id(), target);
  }

  // optional string email = 3;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_email().data(), static_cast<int>(this->_internal_email().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "Messages.Person.email");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_email(), target);
  }

  // repeated .Messages.Person.PhoneNumber phones = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_phones_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_phones(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:Messages.Person)
  return target;
}